

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_node.cpp
# Opt level: O2

void fe_im_empty(fe_im *empty)

{
  (empty->image).data = (uint8_t *)0x1;
  (empty->image).w = 0;
  (empty->image).h = 0;
  (empty->image).pitch = 4;
  (empty->image).bytespp = 4;
  (empty->image).format = FE_IMG_R8G8B8A8;
  (empty->image).free = (free_image_fn)0x0;
  empty->x = 0;
  empty->y = 0;
  return;
}

Assistant:

void fe_im_empty(fe_im& empty)
{
    empty.x = 0;
    empty.y = 0;
    empty.image.w = 0;
    empty.image.h = 0;
    empty.image.data = (uint8_t*)1;
    empty.image.bytespp = 4;
    empty.image.pitch = 4;
    empty.image.format = FE_IMG_R8G8B8A8;
    empty.image.free = 0;
}